

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price.h
# Opt level: O0

uint32_t rc_bittree_reverse_price(probability *probs,uint32_t bit_levels,uint32_t symbol)

{
  uint bit_00;
  uint32_t uVar1;
  uint local_20;
  uint32_t bit;
  uint32_t model_index;
  uint32_t price;
  uint32_t symbol_local;
  uint32_t bit_levels_local;
  probability *probs_local;
  
  bit = 0;
  local_20 = 1;
  model_index = symbol;
  price = bit_levels;
  do {
    bit_00 = model_index & 1;
    model_index = model_index >> 1;
    uVar1 = rc_bit_price(probs[local_20],bit_00);
    bit = uVar1 + bit;
    local_20 = local_20 * 2 + bit_00;
    price = price - 1;
  } while (price != 0);
  return bit;
}

Assistant:

static inline uint32_t
rc_bittree_reverse_price(const probability *const probs,
		uint32_t bit_levels, uint32_t symbol)
{
	uint32_t price = 0;
	uint32_t model_index = 1;

	do {
		const uint32_t bit = symbol & 1;
		symbol >>= 1;
		price += rc_bit_price(probs[model_index], bit);
		model_index = (model_index << 1) + bit;
	} while (--bit_levels != 0);

	return price;
}